

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void __thiscall tcu::astc::anon_unknown_0::Block128::Block128(Block128 *this,deUint8 *src)

{
  int local_20;
  int local_1c;
  int byteNdx;
  int wordNdx;
  deUint8 *src_local;
  Block128 *this_local;
  
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    this->m_words[local_1c] = 0;
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      this->m_words[local_1c] =
           (ulong)src[local_1c * 8 + local_20] << ((byte)(local_20 << 3) & 0x3f) |
           this->m_words[local_1c];
    }
  }
  return;
}

Assistant:

Block128 (const deUint8* src)
	{
		for (int wordNdx = 0; wordNdx < NUM_WORDS; wordNdx++)
		{
			m_words[wordNdx] = 0;
			for (int byteNdx = 0; byteNdx < WORD_BYTES; byteNdx++)
				m_words[wordNdx] |= (Word)src[wordNdx*WORD_BYTES + byteNdx] << (8*byteNdx);
		}
	}